

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O3

void __thiscall
yy::parser::basic_symbol<yy::parser::by_kind>::basic_symbol
          (basic_symbol<yy::parser::by_kind> *this,basic_symbol<yy::parser::by_kind> *that)

{
  value_type *this_00;
  filename_type *pfVar1;
  counter_type cVar2;
  counter_type cVar3;
  counter_type cVar4;
  counter_type cVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u;
  
  (this->super_by_kind).kind_ = (that->super_by_kind).kind_;
  (that->super_by_kind).kind_ = S_YYEMPTY;
  *(undefined8 *)((long)&(this->value).field_0 + 0x10) = 0;
  *(undefined8 *)((long)&(this->value).field_0 + 0x18) = 0;
  *(undefined8 *)&(this->value).field_0 = 0;
  *(undefined8 *)((long)&(this->value).field_0 + 8) = 0;
  (this->value).yytypeid_ = (type_info *)0x0;
  cVar2 = (that->location).begin.line;
  cVar3 = (that->location).begin.column;
  pfVar1 = (that->location).end.filename;
  cVar4 = (that->location).end.line;
  cVar5 = (that->location).end.column;
  (this->location).begin.filename = (that->location).begin.filename;
  (this->location).begin.line = cVar2;
  (this->location).begin.column = cVar3;
  (this->location).end.filename = pfVar1;
  (this->location).end.line = cVar4;
  (this->location).end.column = cVar5;
  uVar6 = (ulong)(uint)(this->super_by_kind).kind_;
  if (uVar6 < 0x2c) {
    this_00 = &this->value;
    if ((0xd61c0000000U >> (uVar6 & 0x3f) & 1) == 0) {
      if ((0x70880UL >> (uVar6 & 0x3f) & 1) != 0) {
        u = value_type::as<std::__cxx11::string>(&that->value);
        value_type::emplace<std::__cxx11::string,std::__cxx11::string>(this_00,u);
        value_type::destroy<std::__cxx11::string>(&that->value);
        return;
      }
      if (uVar6 == 0xe) {
        value_type::move<ReferenceType>(this_00,&that->value);
      }
    }
    else {
      value_type::move<unsigned_long>(this_00,&that->value);
    }
  }
  return;
}

Assistant:

inline
  parser::by_kind::by_kind (by_kind&& that) YY_NOEXCEPT
    : kind_ (that.kind_)
  {
    that.clear ();
  }